

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O1

CK_RV __thiscall
SoftHSM::generateGeneric
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_ATTRIBUTE_PTR pTemplate,CK_ULONG ulCount,
          CK_OBJECT_HANDLE_PTR phKey,CK_BBOOL isOnToken,CK_BBOOL isPrivate)

{
  ulong uVar1;
  void *pvVar2;
  SoftHSM *pSVar3;
  CK_OBJECT_HANDLE_PTR pCVar4;
  char cVar5;
  byte bVar6;
  int iVar7;
  Session *this_00;
  unsigned_long *puVar8;
  CryptoFactory *pCVar9;
  undefined4 extraout_var;
  ulong uVar10;
  long *plVar11;
  ByteString *pBVar12;
  CK_ULONG CVar13;
  CK_ULONG CVar14;
  CK_RV CVar15;
  char *format;
  ulong inBitLen;
  bool bVar16;
  CK_KEY_TYPE keyType;
  SymmetricKey symKey;
  ByteString kcv;
  ByteString value;
  CK_OBJECT_CLASS objClass;
  ByteString key;
  CK_ATTRIBUTE keyAttribs [32];
  CK_BBOOL local_735;
  uint local_734;
  SoftHSM *local_730;
  Token *local_728;
  CK_OBJECT_HANDLE_PTR local_720;
  undefined8 local_718;
  SymmetricKey local_710;
  ByteString local_6d8;
  ByteString local_6b0;
  undefined8 local_688;
  ByteString local_680;
  undefined1 local_658 [160];
  OSAttribute local_5b8;
  OSAttribute local_518;
  OSAttribute local_478;
  OSAttribute local_3d8;
  _CK_ATTRIBUTE local_338;
  undefined8 local_320;
  CK_BBOOL *local_318;
  undefined8 local_310;
  undefined8 local_308;
  CK_BBOOL *local_300;
  undefined8 local_2f8;
  undefined8 local_2f0;
  undefined8 *local_2e8;
  undefined8 local_2e0;
  
  *phKey = 0;
  CVar13 = ulCount;
  local_735 = isOnToken;
  this_00 = (Session *)HandleManager::getSession(this->handleManager,hSession);
  if (this_00 == (Session *)0x0) {
    CVar15 = 0xb3;
  }
  else {
    local_728 = Session::getToken(this_00);
    CVar15 = 5;
    if (local_728 != (Token *)0x0) {
      local_730 = this;
      if (ulCount == 0) {
        local_734 = (uint)CONCAT71((int7)((ulong)local_728 >> 8),1);
        inBitLen = 0;
      }
      else {
        puVar8 = &pTemplate->ulValueLen;
        local_734 = (uint)CONCAT71((int7)(CVar13 >> 8),1);
        inBitLen = 0;
        CVar13 = ulCount;
        do {
          if (((_CK_ATTRIBUTE *)(puVar8 + -2))->type == 0x90) {
            if (*puVar8 != 0) {
              format = "CKA_CHECK_VALUE must be a no-value (0 length) entry";
              iVar7 = 0x1d7d;
              goto LAB_0013b702;
            }
            local_734 = 0;
          }
          else if (((_CK_ATTRIBUTE *)(puVar8 + -2))->type == 0x161) {
            if (*puVar8 != 8) {
              format = "CKA_VALUE_LEN does not have the size of CK_ULONG";
              iVar7 = 0x1d75;
              goto LAB_0013b702;
            }
            inBitLen = *(ulong *)puVar8[-1];
          }
          puVar8 = puVar8 + 3;
          CVar13 = CVar13 - 1;
        } while (CVar13 != 0);
      }
      if (inBitLen == 0) {
        softHSMLog(6,"generateGeneric",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                   ,0x1d8a,"Missing CKA_VALUE_LEN in pTemplate");
        CVar15 = 0xd0;
      }
      else if (inBitLen < 0x8000001) {
        local_720 = phKey;
        pCVar9 = CryptoFactory::i();
        iVar7 = (*pCVar9->_vptr_CryptoFactory[8])(pCVar9,1);
        plVar11 = (long *)CONCAT44(extraout_var,iVar7);
        if (plVar11 != (long *)0x0) {
          ByteString::ByteString(&local_680);
          cVar5 = (**(code **)(*plVar11 + 0x10))(plVar11,&local_680,inBitLen);
          CVar15 = 5;
          if (cVar5 != '\0') {
            local_688 = 4;
            local_718 = 0x10;
            memset(&local_338,0,0x300);
            pCVar4 = local_720;
            local_338.ulValueLen = 8;
            local_320 = 1;
            local_318 = &local_735;
            local_310 = 1;
            local_308 = 2;
            local_300 = &isPrivate;
            local_2f8 = 1;
            local_2f0 = 0x100;
            local_2e8 = &local_718;
            CVar15 = 0xd1;
            if (ulCount < 0x1d) {
              CVar15 = 0;
            }
            local_2e0 = 8;
            CVar13 = 4;
            uVar10 = 1;
            CVar14 = CVar13;
            if (ulCount - 1 < 0x1c) {
              do {
                uVar1 = pTemplate->type;
                CVar13 = CVar14;
                if (((2 < uVar1) && (uVar1 != 0x90)) && (uVar1 != 0x100)) {
                  CVar13 = CVar14 + 1;
                  (&local_338)[CVar14].ulValueLen = pTemplate->ulValueLen;
                  pvVar2 = pTemplate->pValue;
                  (&local_338)[CVar14].type = pTemplate->type;
                  (&local_338)[CVar14].pValue = pvVar2;
                }
                if (0x1c < ulCount) break;
                pTemplate = pTemplate + 1;
                bVar16 = uVar10 < ulCount;
                uVar10 = uVar10 + 1;
                CVar14 = CVar13;
              } while (bVar16);
            }
            local_338.pValue = &local_688;
            if (ulCount < 0x1d) {
              CVar15 = CreateObject(local_730,hSession,&local_338,CVar13,local_720,4);
            }
            if (CVar15 == 0) {
              plVar11 = (long *)HandleManager::getObject(local_730->handleManager,*pCVar4);
              CVar15 = 6;
              if (((plVar11 != (long *)0x0) &&
                  (cVar5 = (**(code **)(*plVar11 + 0x50))(plVar11), cVar5 != '\0')) &&
                 (cVar5 = (**(code **)(*plVar11 + 0x58))(plVar11,1), cVar5 != '\0')) {
                OSAttribute::OSAttribute(&local_5b8,true);
                cVar5 = (**(code **)(*plVar11 + 0x40))(plVar11,0x163,&local_5b8);
                OSAttribute::~OSAttribute(&local_5b8);
                if (cVar5 == '\0') {
                  cVar5 = '\0';
                }
                else {
                  OSAttribute::OSAttribute(&local_5b8,0x350);
                  cVar5 = (**(code **)(*plVar11 + 0x40))(plVar11,0x166,&local_5b8);
                  OSAttribute::~OSAttribute(&local_5b8);
                }
                bVar16 = (bool)(**(code **)(*plVar11 + 0x20))(plVar11,0x103,0);
                if (cVar5 == '\0') {
                  cVar5 = '\0';
                }
                else {
                  OSAttribute::OSAttribute(&local_3d8,bVar16);
                  cVar5 = (**(code **)(*plVar11 + 0x40))(plVar11,0x165,&local_3d8);
                  OSAttribute::~OSAttribute(&local_3d8);
                }
                bVar6 = (**(code **)(*plVar11 + 0x20))(plVar11,0x162,0);
                if (cVar5 == '\0') {
                  cVar5 = '\0';
                }
                else {
                  OSAttribute::OSAttribute(&local_478,(bool)(bVar6 ^ 1));
                  cVar5 = (**(code **)(*plVar11 + 0x40))(plVar11,0x164,&local_478);
                  OSAttribute::~OSAttribute(&local_478);
                }
                ByteString::ByteString(&local_6b0);
                ByteString::ByteString(&local_6d8);
                SymmetricKey::SymmetricKey(&local_710,0);
                SymmetricKey::setKeyBits(&local_710,&local_680);
                SymmetricKey::setBitLen(&local_710,inBitLen);
                if (isPrivate == '\0') {
                  pBVar12 = SymmetricKey::getKeyBits(&local_710);
                  ByteString::operator=(&local_6b0,pBVar12);
                  SymmetricKey::getKeyCheckValue((ByteString *)local_658,&local_710);
                  ByteString::operator=(&local_6d8,(ByteString *)local_658);
                }
                else {
                  pBVar12 = SymmetricKey::getKeyBits(&local_710);
                  Token::encrypt(local_728,(char *)pBVar12,(int)&local_6b0);
                  SymmetricKey::getKeyCheckValue((ByteString *)local_658,&local_710);
                  Token::encrypt(local_728,local_658,(int)&local_6d8);
                }
                local_658._0_8_ = &PTR__ByteString_0019f880;
                std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                          ((_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_> *)
                           (local_658 + 8));
                if (cVar5 == '\0') {
                  cVar5 = '\0';
                }
                else {
                  OSAttribute::OSAttribute((OSAttribute *)local_658,&local_6b0);
                  cVar5 = (**(code **)(*plVar11 + 0x40))(plVar11,0x11,local_658);
                  OSAttribute::~OSAttribute((OSAttribute *)local_658);
                }
                if ((local_734 & 1) != 0) {
                  if (cVar5 == '\0') {
                    cVar5 = '\0';
                  }
                  else {
                    OSAttribute::OSAttribute(&local_518,&local_6d8);
                    cVar5 = (**(code **)(*plVar11 + 0x40))(plVar11,0x90,&local_518);
                    OSAttribute::~OSAttribute(&local_518);
                  }
                }
                if (cVar5 == '\0') {
                  (**(code **)(*plVar11 + 0x68))(plVar11);
                  cVar5 = '\0';
                }
                else {
                  cVar5 = (**(code **)(*plVar11 + 0x60))(plVar11);
                }
                CVar15 = 6;
                if (cVar5 != '\0') {
                  CVar15 = 0;
                }
                local_710.super_Serialisable._vptr_Serialisable =
                     (_func_int **)&PTR_serialise_0019ddb8;
                local_710.keyData._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
                std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                          (&local_710.keyData.byteString.
                            super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
                local_6d8._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
                std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                          (&local_6d8.byteString.
                            super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
                local_6b0._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
                std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                          (&local_6b0.byteString.
                            super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
              }
            }
            pSVar3 = local_730;
            if ((CVar15 != 0) && (*pCVar4 != 0)) {
              plVar11 = (long *)HandleManager::getObject(local_730->handleManager,*pCVar4);
              HandleManager::destroyObject(pSVar3->handleManager,*pCVar4);
              if (plVar11 != (long *)0x0) {
                (**(code **)(*plVar11 + 0x70))(plVar11);
              }
              *pCVar4 = 0;
            }
          }
          local_680._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
          std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                    (&local_680.byteString.
                      super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
        }
      }
      else {
        format = "bad generic key length";
        iVar7 = 0x1d91;
LAB_0013b702:
        softHSMLog(6,"generateGeneric",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                   ,iVar7,format);
        CVar15 = 0x13;
      }
    }
  }
  return CVar15;
}

Assistant:

CK_RV SoftHSM::generateGeneric
(CK_SESSION_HANDLE hSession,
	CK_ATTRIBUTE_PTR pTemplate,
	CK_ULONG ulCount,
	CK_OBJECT_HANDLE_PTR phKey,
	CK_BBOOL isOnToken,
	CK_BBOOL isPrivate)
{
	*phKey = CK_INVALID_HANDLE;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL)
		return CKR_SESSION_HANDLE_INVALID;

	// Get the token
	Token* token = session->getToken();
	if (token == NULL)
		return CKR_GENERAL_ERROR;

	// Extract desired parameter information
	size_t keyLen = 0;
	bool checkValue = true;
	for (CK_ULONG i = 0; i < ulCount; i++)
	{
		switch (pTemplate[i].type)
		{
			case CKA_VALUE_LEN:
				if (pTemplate[i].ulValueLen != sizeof(CK_ULONG))
				{
					INFO_MSG("CKA_VALUE_LEN does not have the size of CK_ULONG");
					return CKR_ATTRIBUTE_VALUE_INVALID;
				}
				keyLen = *(CK_ULONG*)pTemplate[i].pValue;
				break;
			case CKA_CHECK_VALUE:
				if (pTemplate[i].ulValueLen > 0)
				{
					INFO_MSG("CKA_CHECK_VALUE must be a no-value (0 length) entry");
					return CKR_ATTRIBUTE_VALUE_INVALID;
				}
				checkValue = false;
				break;
			default:
				break;
		}
	}

	// CKA_VALUE_LEN must be specified
	if (keyLen == 0)
	{
		INFO_MSG("Missing CKA_VALUE_LEN in pTemplate");
		return CKR_TEMPLATE_INCOMPLETE;
	}

	// Check keyLen
	if (keyLen < 1 || keyLen > 0x8000000)
	{
		INFO_MSG("bad generic key length");
		return CKR_ATTRIBUTE_VALUE_INVALID;
	}

	// Generate the secret key
	RNG* rng = CryptoFactory::i()->getRNG();
	if (rng == NULL) return CKR_GENERAL_ERROR;
	ByteString key;
	if (!rng->generateRandom(key, keyLen)) return CKR_GENERAL_ERROR;

        CK_RV rv = CKR_OK;

	// Create the secret key object using C_CreateObject
	const CK_ULONG maxAttribs = 32;
	CK_OBJECT_CLASS objClass = CKO_SECRET_KEY;
	CK_KEY_TYPE keyType = CKK_GENERIC_SECRET;
	CK_ATTRIBUTE keyAttribs[maxAttribs] = {
		{ CKA_CLASS, &objClass, sizeof(objClass) },
		{ CKA_TOKEN, &isOnToken, sizeof(isOnToken) },
		{ CKA_PRIVATE, &isPrivate, sizeof(isPrivate) },
		{ CKA_KEY_TYPE, &keyType, sizeof(keyType) },
	};
	CK_ULONG keyAttribsCount = 4;

	// Add the additional
	if (ulCount > (maxAttribs - keyAttribsCount))
		rv = CKR_TEMPLATE_INCONSISTENT;
	for (CK_ULONG i=0; i < ulCount && rv == CKR_OK; ++i)
	{
		switch (pTemplate[i].type)
		{
			case CKA_CLASS:
			case CKA_TOKEN:
			case CKA_PRIVATE:
			case CKA_KEY_TYPE:
			case CKA_CHECK_VALUE:
				continue;
			default:
				keyAttribs[keyAttribsCount++] = pTemplate[i];
				break;
		}
	}

	if (rv == CKR_OK)
		rv = CreateObject(hSession, keyAttribs, keyAttribsCount, phKey, OBJECT_OP_GENERATE);

	// Store the attributes that are being supplied
	if (rv == CKR_OK)
	{
		OSObject* osobject = (OSObject*)handleManager->getObject(*phKey);
		if (osobject == NULL_PTR || !osobject->isValid()) {
			rv = CKR_FUNCTION_FAILED;
		} else if (osobject->startTransaction()) {
			bool bOK = true;

			// Common Attributes
			bOK = bOK && osobject->setAttribute(CKA_LOCAL,true);
			CK_ULONG ulKeyGenMechanism = (CK_ULONG)CKM_GENERIC_SECRET_KEY_GEN;
			bOK = bOK && osobject->setAttribute(CKA_KEY_GEN_MECHANISM,ulKeyGenMechanism);

			// Common Secret Key Attributes
			bool bAlwaysSensitive = osobject->getBooleanValue(CKA_SENSITIVE, false);
			bOK = bOK && osobject->setAttribute(CKA_ALWAYS_SENSITIVE,bAlwaysSensitive);
			bool bNeverExtractable = osobject->getBooleanValue(CKA_EXTRACTABLE, false) == false;
			bOK = bOK && osobject->setAttribute(CKA_NEVER_EXTRACTABLE, bNeverExtractable);

			// Generic Secret Key Attributes
			ByteString value;
			ByteString kcv;
			SymmetricKey symKey;
			symKey.setKeyBits(key);
			symKey.setBitLen(keyLen);
			if (isPrivate)
			{
				token->encrypt(symKey.getKeyBits(), value);
				token->encrypt(symKey.getKeyCheckValue(), kcv);
			}
			else
			{
				value = symKey.getKeyBits();
				kcv = symKey.getKeyCheckValue();
			}
			bOK = bOK && osobject->setAttribute(CKA_VALUE, value);
			if (checkValue)
				bOK = bOK && osobject->setAttribute(CKA_CHECK_VALUE, kcv);

			if (bOK)
				bOK = osobject->commitTransaction();
			else
				osobject->abortTransaction();

			if (!bOK)
				rv = CKR_FUNCTION_FAILED;
		} else
			rv = CKR_FUNCTION_FAILED;
	}

	// Clean up
	// Remove the key that may have been created already when the function fails.
	if (rv != CKR_OK)
	{
		if (*phKey != CK_INVALID_HANDLE)
		{
			OSObject* oskey = (OSObject*)handleManager->getObject(*phKey);
			handleManager->destroyObject(*phKey);
			if (oskey) oskey->destroyObject();
			*phKey = CK_INVALID_HANDLE;
		}
	}

	return rv;
}